

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.c
# Opt level: O3

void test_late_ack(void)

{
  byte *pbVar1;
  quicly_sent_t *pqVar2;
  int iVar3;
  st_quicly_sent_block_t *psVar4;
  size_t sVar5;
  quicly_sentmap_iter_t local_60;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  quicly_sent_t *local_28;
  
  on_acked_callcnt = 0;
  on_acked_ackcnt = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (undefined1  [16])0x0;
  local_28 = (quicly_sent_t *)0x0;
  quicly_sentmap_prepare((quicly_sentmap_t *)local_48,1,0,'\0');
  if (((st_quicly_sent_block_t *)local_48._8_8_ == (st_quicly_sent_block_t *)0x0) ||
     (sVar5 = *(size_t *)(local_48._8_8_ + 0x10), psVar4 = (st_quicly_sent_block_t *)local_48._8_8_,
     sVar5 == 0x10)) {
    psVar4 = quicly_sentmap__new_block((quicly_sentmap_t *)local_48);
    if (psVar4 != (st_quicly_sent_block_t *)0x0) {
      sVar5 = psVar4->next_insert_at;
      goto LAB_0011df66;
    }
  }
  else {
LAB_0011df66:
    psVar4->next_insert_at = sVar5 + 1;
    psVar4->num_entries = psVar4->num_entries + 1;
    psVar4->entries[sVar5].acked = on_acked;
  }
  if (local_28 == (quicly_sent_t *)0x0) goto LAB_0011e304;
  pbVar1 = (byte *)((long)&local_28->data + 0x11);
  *pbVar1 = *pbVar1 | 1;
  (local_28->data).packet.cc_bytes_in_flight = 10;
  local_38._8_8_ = local_38._8_8_ + 10;
  local_38._0_8_ = local_38._0_8_ + 1;
  pbVar1 = (byte *)((long)&local_28->data + 0x11);
  *pbVar1 = *pbVar1 | 2;
  local_28 = (quicly_sent_t *)0x0;
  quicly_sentmap_prepare((quicly_sentmap_t *)local_48,2,0,'\0');
  if (((st_quicly_sent_block_t *)local_48._8_8_ == (st_quicly_sent_block_t *)0x0) ||
     (sVar5 = *(size_t *)(local_48._8_8_ + 0x10), psVar4 = (st_quicly_sent_block_t *)local_48._8_8_,
     sVar5 == 0x10)) {
    psVar4 = quicly_sentmap__new_block((quicly_sentmap_t *)local_48);
    if (psVar4 != (st_quicly_sent_block_t *)0x0) {
      sVar5 = psVar4->next_insert_at;
      goto LAB_0011dffc;
    }
  }
  else {
LAB_0011dffc:
    psVar4->next_insert_at = sVar5 + 1;
    psVar4->num_entries = psVar4->num_entries + 1;
    psVar4->entries[sVar5].acked = on_acked;
  }
  if (local_28 == (quicly_sent_t *)0x0) {
LAB_0011e304:
    __assert_fail("quicly_sentmap_is_open(map)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                  ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
  }
  pbVar1 = (byte *)((long)&local_28->data + 0x11);
  *pbVar1 = *pbVar1 | 1;
  (local_28->data).packet.cc_bytes_in_flight = 0x14;
  local_38._0_8_ = local_38._0_8_ + 1;
  local_38._8_8_ = local_38._8_8_ + 0x14;
  pbVar1 = (byte *)((long)&local_28->data + 0x11);
  *pbVar1 = *pbVar1 | 2;
  local_28 = (quicly_sent_t *)0x0;
  _ok((uint)(local_38._8_8_ == 0x1e),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x7a);
  local_60.ref = (st_quicly_sent_block_t **)local_48;
  if ((st_quicly_sent_block_t *)local_48._0_8_ == (st_quicly_sent_block_t *)0x0) {
    local_60.p = &quicly_sentmap__end_iter;
    local_60.count = 0;
    sVar5 = local_60.count;
  }
  else {
    if (*(size_t *)(local_48._0_8_ + 8) == 0) goto LAB_0011e342;
    local_60.p = (quicly_sent_t *)
                 ((long)&((st_quicly_sent_block_t *)(local_48._0_8_ + -0x218))->entries[0xf].data +
                 0x10);
    do {
      pqVar2 = local_60.p + 1;
      local_60.p = local_60.p + 1;
    } while (pqVar2->acked == (quicly_sent_acked_cb)0x0);
    sVar5 = *(size_t *)(local_48._0_8_ + 8);
    if (pqVar2->acked != quicly_sentmap__type_packet) goto LAB_0011e361;
  }
  local_60.count = sVar5;
  if (((local_60.p)->data).packet.packet_number != 1) {
    __assert_fail("sent->packet_number == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x7f,"void test_late_ack(void)");
  }
  iVar3 = quicly_sentmap_update((quicly_sentmap_t *)local_48,&local_60,QUICLY_SENTMAP_EVENT_LOST);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x80);
  _ok((uint)(on_acked_callcnt == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x81);
  _ok((uint)(on_acked_ackcnt == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x82);
  _ok((uint)(local_38._8_8_ == 0x14),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x83);
  if ((st_quicly_sent_block_t *)local_48._0_8_ == (st_quicly_sent_block_t *)0x0) {
    local_60.p = &quicly_sentmap__end_iter;
    local_60.count = 0;
    sVar5 = local_60.count;
  }
  else {
    if (*(size_t *)(local_48._0_8_ + 8) == 0) {
LAB_0011e342:
      local_60.ref = (st_quicly_sent_block_t **)local_48;
      __assert_fail("map->head->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x12f,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
    local_60.p = (quicly_sent_t *)
                 ((long)&((st_quicly_sent_block_t *)(local_48._0_8_ + -0x218))->entries[0xf].data +
                 0x10);
    do {
      pqVar2 = local_60.p + 1;
      local_60.p = local_60.p + 1;
    } while (pqVar2->acked == (quicly_sent_acked_cb)0x0);
    sVar5 = *(size_t *)(local_48._0_8_ + 8);
    if (pqVar2->acked != quicly_sentmap__type_packet) {
LAB_0011e361:
      local_60.ref = (st_quicly_sent_block_t **)local_48;
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x132,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
  }
  local_60.count = sVar5;
  if (((local_60.p)->data).packet.packet_number != 1) {
    local_60.ref = (st_quicly_sent_block_t **)local_48;
    __assert_fail("sent->packet_number == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x88,"void test_late_ack(void)");
  }
  local_60.ref = (st_quicly_sent_block_t **)local_48;
  iVar3 = quicly_sentmap_update((quicly_sentmap_t *)local_48,&local_60,QUICLY_SENTMAP_EVENT_ACKED);
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c",
      0x89);
  if ((local_60.p)->acked == quicly_sentmap__type_packet) {
    if (((local_60.p)->data).packet.packet_number == 2) {
      iVar3 = quicly_sentmap_update
                        ((quicly_sentmap_t *)local_48,&local_60,QUICLY_SENTMAP_EVENT_ACKED);
      _ok((uint)(iVar3 == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8c);
      _ok((uint)(on_acked_callcnt == 3),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8d);
      _ok((uint)(on_acked_ackcnt == 2),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8e);
      _ok((uint)(local_38._8_8_ == 0),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
          ,0x8f);
      quicly_sentmap_dispose((quicly_sentmap_t *)local_48);
      return;
    }
    __assert_fail("sent->packet_number == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/sentmap.c"
                  ,0x8b,"void test_late_ack(void)");
  }
  __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
}

Assistant:

static void test_late_ack(void)
{
    quicly_sentmap_t map;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;

    on_acked_callcnt = 0;
    on_acked_ackcnt = 0;

    quicly_sentmap_init(&map);

    /* commit pn 1, 2 */
    quicly_sentmap_prepare(&map, 1, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 10);
    quicly_sentmap_prepare(&map, 2, 0, QUICLY_EPOCH_INITIAL);
    quicly_sentmap_allocate(&map, on_acked);
    quicly_sentmap_commit(&map, 20);
    ok(map.bytes_in_flight == 30);

    /* mark pn 1 as lost */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_LOST) == 0);
    ok(on_acked_callcnt == 1);
    ok(on_acked_ackcnt == 0);
    ok(map.bytes_in_flight == 20);

    /* mark pn 1, 2 as acked */
    quicly_sentmap_init_iter(&map, &iter);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 1);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    sent = quicly_sentmap_get(&iter);
    assert(sent->packet_number == 2);
    ok(quicly_sentmap_update(&map, &iter, QUICLY_SENTMAP_EVENT_ACKED) == 0);
    ok(on_acked_callcnt == 3);
    ok(on_acked_ackcnt == 2);
    ok(map.bytes_in_flight == 0);

    quicly_sentmap_dispose(&map);
}